

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

void __thiscall HighsSymmetryDetection::initializeGroundSet(HighsSymmetryDetection *this)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  reference pvVar1;
  iterator __n;
  iterator this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RDI;
  HighsInt i;
  vector<int,_std::allocator<int>_> *in_stack_00000048;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  value_type in_stack_ffffffffffffffb4;
  int iVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar3;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  size_type in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  undefined4 uVar5;
  
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)this,in_stack_00000048);
  std::vector<int,_std::allocator<int>_>::begin
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa8._M_current);
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa8._M_current);
  pdqsort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (in_stack_ffffffffffffffc0,in_RDI);
  std::vector<int,_std::allocator<int>_>::size
            ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 0x26));
  uVar5 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT44(0xffffffff,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8,(value_type_conflict2 *)in_stack_ffffffffffffffd0);
  iVar2 = 0;
  while (iVar2 < in_RDI._M_current[0xab]) {
    in_stack_ffffffffffffffa8._M_current = in_RDI._M_current + 0x2c;
    iVar4 = iVar2;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 0x32),(long)iVar2)
    ;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa8._M_current,
                        (long)*pvVar1);
    *pvVar1 = iVar2;
    in_stack_ffffffffffffffb4 = iVar2;
    iVar2 = iVar4 + 1;
  }
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_ffffffffffffffd0,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
            );
  __n = std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffffa8._M_current);
  this_00 = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffa8._M_current);
  __first._M_current._4_4_ = in_stack_ffffffffffffffb4;
  __first._M_current._0_4_ = in_stack_ffffffffffffffb0;
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
            (__first,in_stack_ffffffffffffffa8,0);
  uVar3 = 1;
  std::vector<int,_std::allocator<int>_>::assign
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (size_type)in_stack_ffffffffffffffa8._M_current,(value_type_conflict2 *)0x6c6d5d);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_00._M_current,
             CONCAT44(uVar3,in_stack_ffffffffffffffc8));
  in_RDI._M_current[0xa8] = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(uVar5,iVar2),
             (size_type)__n._M_current);
  return;
}

Assistant:

void HighsSymmetryDetection::initializeGroundSet() {
  vertexGroundSet = currentPartition;
  pdqsort(vertexGroundSet.begin(), vertexGroundSet.end());
  vertexPosition.resize(vertexToCell.size(), -1);
  for (HighsInt i = 0; i < numVertices; ++i)
    vertexPosition[vertexGroundSet[i]] = i;

  orbitPartition.resize(numVertices);
  std::iota(orbitPartition.begin(), orbitPartition.end(), 0);
  orbitSize.assign(numVertices, 1);

  automorphisms.resize(numVertices * 64);
  numAutomorphisms = 0;
  currNodeCertificate.reserve(numVertices);
}